

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

void __thiscall Oric::VideoOutput::VideoOutput(VideoOutput *this,uint8_t *memory)

{
  CRT *this_00;
  
  this->ram_ = memory;
  this_00 = &this->crt_;
  Outputs::CRT::CRT::CRT(this_00,0x180,1,PAL50,Red1Green1Blue1);
  (this->frequency_mismatch_warner_).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_crt_did_end_batch_of_frames_0059e598;
  (this->frequency_mismatch_warner_).receiver_ = this;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[0].number_of_frames = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[0].number_of_unexpected_vertical_syncs
       = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[1].number_of_frames = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[1].number_of_unexpected_vertical_syncs
       = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[2].number_of_frames = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[2].number_of_unexpected_vertical_syncs
       = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[3].number_of_frames = 0;
  (this->frequency_mismatch_warner_).frame_records_._M_elems[3].number_of_unexpected_vertical_syncs
       = 0;
  *(undefined8 *)
   ((long)&(this->frequency_mismatch_warner_).frame_records_._M_elems[3].number_of_frames + 2) = 0;
  *(undefined8 *)((long)&(this->frequency_mismatch_warner_).frame_record_pointer_ + 2) = 0;
  this->counter_ = 0;
  this->frame_counter_ = 0;
  this->v_sync_start_position_ = 0x4000;
  this->v_sync_end_position_ = 0x40c0;
  this->counter_period_ = 0x4e00;
  this->rgb_pixel_target_ = (uint8_t *)0x0;
  this->composite_pixel_target_ = (uint32_t *)0x0;
  this->character_set_base_address_ = 0xb400;
  this->is_graphics_mode_ = false;
  this->next_frame_is_sixty_hertz_ = false;
  Outputs::CRT::CRT::set_phase_linked_luminance_offset(this_00,-0.125);
  this->data_type_ = Red1Green1Blue1;
  Outputs::CRT::CRT::set_input_data_type(this_00,Red1Green1Blue1);
  (this->crt_).delegate_ = &(this->frequency_mismatch_warner_).super_Delegate;
  update_crt_frequency(this);
  return;
}

Assistant:

VideoOutput::VideoOutput(uint8_t *memory) :
		ram_(memory),
		crt_(64*6, 1, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red1Green1Blue1),
		frequency_mismatch_warner_(*this),
		v_sync_start_position_(PAL50VSyncStartPosition), v_sync_end_position_(PAL50VSyncEndPosition),
		counter_period_(PAL50Period) {
	crt_.set_phase_linked_luminance_offset(-1.0f / 8.0f);
	data_type_ = Outputs::Display::InputDataType::Red1Green1Blue1;
	crt_.set_input_data_type(data_type_);
	crt_.set_delegate(&frequency_mismatch_warner_);
	update_crt_frequency();
}